

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void __thiscall LogMessage::LogMessage(LogMessage *this,char *file,int line)

{
  ostringstream *this_00;
  size_t sVar1;
  ostream *poVar2;
  
  this->flushed_ = false;
  this_00 = &this->str_;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  if (file == (char *)0x0) {
    std::ios::clear((int)this_00 + (int)*(undefined8 *)(*(long *)this_00 + -0x18));
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)this_00,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  return;
}

Assistant:

LogMessage(const char* file, int line)
      : flushed_(false) {
    stream() << file << ":" << line << ": ";
  }